

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMf.c
# Opt level: O3

Gia_Man_t * Mf_ManDeriveMappingGia(Mf_Man_t *p)

{
  Jf_Par_t *pJVar1;
  char *pcVar2;
  Gia_Obj_t *pGVar3;
  void *pvVar4;
  Vec_Mem_t *pVVar5;
  Vec_Int_t *p_00;
  int *piVar6;
  Vec_Int_t *p_01;
  Vec_Int_t *vMemory;
  Vec_Int_t *p_02;
  Gia_Man_t *p_03;
  size_t sVar7;
  char *pcVar8;
  Vec_Int_t *pVVar9;
  Gia_Obj_t *pGVar10;
  uint uVar11;
  int Fill;
  int Fill_00;
  long lVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  Gia_Man_t *pGVar20;
  int iVar21;
  int iVar22;
  ulong uVar23;
  undefined4 *local_70;
  int local_44;
  
  uVar17 = p->pGia->nObjs;
  uVar18 = (ulong)(int)uVar17;
  uVar16 = uVar17;
  if (uVar17 - 1 < 0xf) {
    uVar16 = 0x10;
  }
  if ((uVar16 == 0) ||
     (local_70 = (undefined4 *)malloc((long)(int)uVar16 << 2), local_70 == (undefined4 *)0x0)) {
    local_70 = (undefined4 *)0x0;
  }
  else {
    memset(local_70,0xff,uVar18 * 4);
  }
  pJVar1 = p->pPars;
  iVar21 = (int)pJVar1->Area;
  iVar22 = (int)pJVar1->Edge;
  local_44 = iVar22 + (uVar17 + iVar21) * 2;
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar14 = 0x10;
  if (0xe < (iVar22 + (uVar17 + iVar21) * 2) - 1) {
    iVar14 = local_44;
  }
  p_00->nCap = iVar14;
  if (iVar14 == 0) {
    p_00->pArray = (int *)0x0;
    p_00->nSize = local_44;
  }
  else {
    piVar6 = (int *)malloc((long)iVar14 << 2);
    p_00->pArray = piVar6;
    p_00->nSize = local_44;
    if (piVar6 != (int *)0x0) {
      memset(piVar6,0,(long)local_44 << 2);
      iVar21 = (int)pJVar1->Area;
      iVar22 = (int)pJVar1->Edge;
    }
  }
  iVar15 = iVar22 + iVar21 * 2 + 1000;
  p_01 = (Vec_Int_t *)malloc(0x10);
  iVar14 = 0x10;
  if (0xe < iVar22 + iVar21 * 2 + 999U) {
    iVar14 = iVar15;
  }
  p_01->nCap = iVar14;
  if (iVar14 == 0) {
    p_01->pArray = (int *)0x0;
    p_01->nSize = iVar15;
  }
  else {
    piVar6 = (int *)malloc((long)iVar14 << 2);
    p_01->pArray = piVar6;
    p_01->nSize = iVar15;
    if (piVar6 != (int *)0x0) {
      memset(piVar6,0,(long)iVar15 << 2);
    }
  }
  vMemory = (Vec_Int_t *)malloc(0x10);
  vMemory->nCap = 0x10000;
  vMemory->nSize = 0;
  piVar6 = (int *)malloc(0x40000);
  vMemory->pArray = piVar6;
  p_02 = (Vec_Int_t *)malloc(0x10);
  p_02->nCap = 0x10;
  p_02->nSize = 0;
  piVar6 = (int *)malloc(0x40);
  p_02->pArray = piVar6;
  if (pJVar1->fCutMin == 0) {
    __assert_fail("p->pPars->fCutMin",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaMf.c"
                  ,0x514,"Gia_Man_t *Mf_ManDeriveMappingGia(Mf_Man_t *)");
  }
  p_03 = Gia_ManStart(uVar17);
  pGVar20 = p->pGia;
  pcVar2 = pGVar20->pName;
  if (pcVar2 == (char *)0x0) {
    pcVar8 = (char *)0x0;
  }
  else {
    sVar7 = strlen(pcVar2);
    pcVar8 = (char *)malloc(sVar7 + 1);
    strcpy(pcVar8,pcVar2);
  }
  p_03->pName = pcVar8;
  pcVar2 = pGVar20->pSpec;
  if (pcVar2 == (char *)0x0) {
    pcVar8 = (char *)0x0;
  }
  else {
    sVar7 = strlen(pcVar2);
    pcVar8 = (char *)malloc(sVar7 + 1);
    strcpy(pcVar8,pcVar2);
  }
  p_03->pSpec = pcVar8;
  if ((int)uVar17 < 1) {
LAB_0077ffc5:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
  }
  *local_70 = 0;
  pVVar9 = pGVar20->vCis;
  if (0 < pVVar9->nSize) {
    lVar12 = 0;
    do {
      uVar16 = pVVar9->pArray[lVar12];
      if (((long)(int)uVar16 < 0) || (pGVar20->nObjs <= (int)uVar16)) goto LAB_0077ff49;
      if (uVar16 == 0) break;
      pGVar10 = Gia_ManAppendObj(p_03);
      uVar13 = *(ulong *)pGVar10;
      *(ulong *)pGVar10 = uVar13 | 0x9fffffff;
      *(ulong *)pGVar10 =
           uVar13 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_03->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar3 = p_03->pObjs;
      if ((pGVar10 < pGVar3) || (pGVar3 + p_03->nObjs <= pGVar10)) {
LAB_0077ff68:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_03->vCis,(int)((ulong)((long)pGVar10 - (long)pGVar3) >> 2) * -0x55555555);
      pGVar3 = p_03->pObjs;
      if ((pGVar10 < pGVar3) || (pGVar3 + p_03->nObjs <= pGVar10)) goto LAB_0077ff68;
      if (uVar17 <= uVar16) goto LAB_0077ffc5;
      local_70[(int)uVar16] = (int)((ulong)((long)pGVar10 - (long)pGVar3) >> 2) * 0x55555556;
      lVar12 = lVar12 + 1;
      pGVar20 = p->pGia;
      pVVar9 = pGVar20->vCis;
    } while (lVar12 < pVVar9->nSize);
  }
  if (0 < pGVar20->nObjs) {
    uVar13 = 0;
    do {
      if (pGVar20->pObjs == (Gia_Obj_t *)0x0) break;
      uVar16 = *(uint *)(pGVar20->pObjs + uVar13);
      if ((~uVar16 & 0x1fffffff) != 0 && -1 < (int)uVar16) {
        if (0xffff < *(uint *)&p->pLfObjs[uVar13].field_0xc) {
          uVar16 = p->pLfObjs[uVar13].iCutSet;
          uVar11 = (int)uVar16 >> 0x10;
          if (((int)uVar11 < 0) || ((p->vPages).nSize <= (int)uVar11)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          pvVar4 = (p->vPages).pArray[uVar11];
          uVar23 = (ulong)(uVar16 & 0xffff);
          uVar16 = *(uint *)((long)pvVar4 + uVar23 * 4 + 4);
          if ((uVar16 & 0x1f) == 1) {
            if ((uVar16 & 0xffffffc0) != 0x40) {
              __assert_fail("Abc_Lit2Var(Mf_CutFunc(pCut)) == 1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaMf.c"
                            ,0x52b,"Gia_Man_t *Mf_ManDeriveMappingGia(Mf_Man_t *)");
            }
            uVar11 = *(uint *)((long)pvVar4 + uVar23 * 4 + 8);
            if (uVar17 <= uVar11) goto LAB_0077ff87;
            if ((int)local_70[uVar11] < 0) goto LAB_0077ffe4;
            if (uVar18 <= uVar13) goto LAB_0077ffc5;
            local_70[uVar13] = local_70[uVar11] ^ uVar16 >> 5 & 1;
          }
          else if ((uVar16 & 0x1f) == 0) {
            if (0x3f < uVar16) {
              __assert_fail("Abc_Lit2Var(Mf_CutFunc(pCut)) == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaMf.c"
                            ,0x525,"Gia_Man_t *Mf_ManDeriveMappingGia(Mf_Man_t *)");
            }
            if (uVar18 <= uVar13) goto LAB_0077ffc5;
            local_70[uVar13] = uVar16 >> 5;
          }
          else {
            p_02->nSize = 0;
            uVar16 = *(uint *)((long)pvVar4 + uVar23 * 4 + 4);
            if ((uVar16 & 0x1f) != 0) {
              uVar19 = 0;
              do {
                uVar16 = *(uint *)((long)pvVar4 + uVar19 * 4 + uVar23 * 4 + 8);
                if (uVar17 <= uVar16) goto LAB_0077ff87;
                Vec_IntPush(p_02,local_70[uVar16]);
                uVar16 = *(uint *)((long)pvVar4 + uVar23 * 4 + 4);
                uVar19 = uVar19 + 1;
              } while (uVar19 < (uVar16 & 0x1f));
            }
            pVVar5 = p->vTtMem;
            uVar16 = uVar16 >> 6;
            if (pVVar5->nEntries <= (int)uVar16) {
              __assert_fail("i >= 0 && i < p->nEntries",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecMem.h"
                            ,0xc9,"word *Vec_MemReadEntry(Vec_Mem_t *, int)");
            }
            uVar16 = Kit_TruthToGia(p_03,(uint *)(pVVar5->ppPages
                                                  [uVar16 >> ((byte)pVVar5->LogPageSze & 0x1f)] +
                                                 (ulong)(uVar16 & pVVar5->PageMask) *
                                                 (long)pVVar5->nEntrySize),p_02->nSize,vMemory,p_02,
                                    0);
            if ((int)uVar16 < 0) goto LAB_0077ffe4;
            if (uVar18 <= uVar13) goto LAB_0077ffc5;
            local_70[uVar13] = *(uint *)((long)pvVar4 + uVar23 * 4 + 4) >> 5 & 1 ^ uVar16;
            uVar16 = uVar16 >> 1;
            iVar21 = p_01->nSize;
            Vec_IntFillExtra(p_00,uVar16 + 1,Fill);
            local_44 = p_00->nSize;
            if (local_44 <= (int)uVar16) goto LAB_0077ffc5;
            p_00->pArray[uVar16] = iVar21;
            Vec_IntPush(p_01,p_02->nSize);
            if (0 < p_02->nSize) {
              lVar12 = 0;
              do {
                if (p_02->pArray[lVar12] < 0) goto LAB_0077ffa6;
                Vec_IntPush(p_01,(uint)p_02->pArray[lVar12] >> 1);
                lVar12 = lVar12 + 1;
              } while (lVar12 < p_02->nSize);
            }
            if ((int)local_70[uVar13] < 0) {
LAB_0077ffa6:
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                            ,0x12f,"int Abc_Lit2Var(int)");
            }
            Vec_IntPush(p_01,(uint)local_70[uVar13] >> 1);
            pGVar20 = p->pGia;
          }
        }
      }
      uVar13 = uVar13 + 1;
    } while ((long)uVar13 < (long)pGVar20->nObjs);
  }
  pVVar9 = pGVar20->vCos;
  if (0 < pVVar9->nSize) {
    lVar12 = 0;
    do {
      iVar21 = pVVar9->pArray[lVar12];
      if (((long)iVar21 < 0) || (pGVar20->nObjs <= iVar21)) {
LAB_0077ff49:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (pGVar20->pObjs == (Gia_Obj_t *)0x0) break;
      uVar16 = *(uint *)(pGVar20->pObjs + iVar21);
      uVar11 = iVar21 - (uVar16 & 0x1fffffff);
      if (uVar17 <= uVar11) {
LAB_0077ff87:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if ((int)local_70[uVar11] < 0) {
LAB_0077ffe4:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x132,"int Abc_LitNotCond(int, int)");
      }
      Gia_ManAppendCo(p_03,local_70[uVar11] ^ uVar16 >> 0x1d & 1);
      lVar12 = lVar12 + 1;
      pGVar20 = p->pGia;
      pVVar9 = pGVar20->vCos;
    } while (lVar12 < pVVar9->nSize);
  }
  free(local_70);
  if (vMemory->pArray != (int *)0x0) {
    free(vMemory->pArray);
  }
  free(vMemory);
  if (p_02->pArray != (int *)0x0) {
    free(p_02->pArray);
  }
  free(p_02);
  uVar17 = p_03->nObjs;
  if ((int)uVar17 < local_44) {
    p_00->nSize = uVar17;
  }
  else {
    Vec_IntFillExtra(p_00,uVar17,Fill_00);
    uVar17 = p_03->nObjs;
    if (p_00->nSize != uVar17) {
      __assert_fail("Vec_IntSize(vMapping) == Gia_ManObjNum(pNew)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaMf.c"
                    ,0x54a,"Gia_Man_t *Mf_ManDeriveMappingGia(Mf_Man_t *)");
    }
  }
  if (0 < (int)uVar17) {
    piVar6 = p_00->pArray;
    uVar18 = 0;
    do {
      iVar21 = piVar6[uVar18];
      if (0 < iVar21) {
        piVar6[uVar18] = iVar21 + p_03->nObjs;
      }
      uVar18 = uVar18 + 1;
    } while (uVar18 < uVar17);
  }
  iVar21 = p_01->nSize;
  piVar6 = p_01->pArray;
  if ((long)iVar21 < 1) {
    if (piVar6 == (int *)0x0) goto LAB_0077ff06;
  }
  else {
    lVar12 = 0;
    do {
      Vec_IntPush(p_00,piVar6[lVar12]);
      lVar12 = lVar12 + 1;
    } while (iVar21 != lVar12);
  }
  free(piVar6);
LAB_0077ff06:
  free(p_01);
  if (p_03->vMapping != (Vec_Int_t *)0x0) {
    __assert_fail("pNew->vMapping == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaMf.c"
                  ,0x551,"Gia_Man_t *Mf_ManDeriveMappingGia(Mf_Man_t *)");
  }
  p_03->vMapping = p_00;
  Gia_ManSetRegNum(p_03,p->pGia->nRegs);
  return p_03;
}

Assistant:

Gia_Man_t * Mf_ManDeriveMappingGia( Mf_Man_t * p )
{
    Gia_Man_t * pNew; 
    Gia_Obj_t * pObj; 
    Vec_Int_t * vCopies   = Vec_IntStartFull( Gia_ManObjNum(p->pGia) );
    Vec_Int_t * vMapping  = Vec_IntStart( 2 * Gia_ManObjNum(p->pGia) + (int)p->pPars->Edge + 2 * (int)p->pPars->Area );
    Vec_Int_t * vMapping2 = Vec_IntStart( (int)p->pPars->Edge + 2 * (int)p->pPars->Area + 1000 );
    Vec_Int_t * vCover    = Vec_IntAlloc( 1 << 16 );
    Vec_Int_t * vLeaves   = Vec_IntAlloc( 16 );
    int i, k, Id, iLit, * pCut;
    word uTruth = 0, * pTruth = &uTruth;
    assert( p->pPars->fCutMin );
    // create new manager
    pNew = Gia_ManStart( Gia_ManObjNum(p->pGia) );
    pNew->pName = Abc_UtilStrsav( p->pGia->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pGia->pSpec );
    // map primary inputs
    Vec_IntWriteEntry( vCopies, 0, 0 );
    Gia_ManForEachCiId( p->pGia, Id, i )
        Vec_IntWriteEntry( vCopies, Id, Gia_ManAppendCi(pNew) );
    // iterate through nodes used in the mapping
    Gia_ManForEachAnd( p->pGia, pObj, i )
    {
        if ( !Mf_ObjMapRefNum(p, i) )
            continue;
        pCut = Mf_ObjCutBest( p, i );
        if ( Mf_CutSize(pCut) == 0 )
        {
            assert( Abc_Lit2Var(Mf_CutFunc(pCut)) == 0 );
            Vec_IntWriteEntry( vCopies, i, Mf_CutFunc(pCut) );
            continue;
        }
        if ( Mf_CutSize(pCut) == 1 )
        {
            assert( Abc_Lit2Var(Mf_CutFunc(pCut)) == 1 );
            iLit = Vec_IntEntry( vCopies, pCut[1] );
            Vec_IntWriteEntry( vCopies, i, Abc_LitNotCond(iLit, Abc_LitIsCompl(Mf_CutFunc(pCut))) );
            continue;
        }
        Vec_IntClear( vLeaves );
        for ( k = 1; k <= Mf_CutSize(pCut); k++ )
            Vec_IntPush( vLeaves, Vec_IntEntry(vCopies, pCut[k]) );
        pTruth = Vec_MemReadEntry( p->vTtMem, Abc_Lit2Var(Mf_CutFunc(pCut)) );
        iLit = Kit_TruthToGia( pNew, (unsigned *)pTruth, Vec_IntSize(vLeaves), vCover, vLeaves, 0 );
        Vec_IntWriteEntry( vCopies, i, Abc_LitNotCond(iLit, Abc_LitIsCompl(Mf_CutFunc(pCut))) );
        // create mapping
        Vec_IntSetEntry( vMapping, Abc_Lit2Var(iLit), Vec_IntSize(vMapping2) );
        Vec_IntPush( vMapping2, Vec_IntSize(vLeaves) );
        Vec_IntForEachEntry( vLeaves, iLit, k )
            Vec_IntPush( vMapping2, Abc_Lit2Var(iLit) );
        Vec_IntPush( vMapping2, Abc_Lit2Var(Vec_IntEntry(vCopies, i)) );
    }
    Gia_ManForEachCo( p->pGia, pObj, i )
    {
        iLit = Vec_IntEntry( vCopies, Gia_ObjFaninId0p(p->pGia, pObj) );
        iLit = Gia_ManAppendCo( pNew, Abc_LitNotCond(iLit, Gia_ObjFaninC0(pObj)) );
    }
    Vec_IntFree( vCopies );
    Vec_IntFree( vCover );
    Vec_IntFree( vLeaves );
    // finish mapping 
    if ( Vec_IntSize(vMapping) > Gia_ManObjNum(pNew) )
        Vec_IntShrink( vMapping, Gia_ManObjNum(pNew) );
    else
        Vec_IntFillExtra( vMapping, Gia_ManObjNum(pNew), 0 );
    assert( Vec_IntSize(vMapping) == Gia_ManObjNum(pNew) );
    Vec_IntForEachEntry( vMapping, iLit, i )
        if ( iLit > 0 )
            Vec_IntAddToEntry( vMapping, i, Gia_ManObjNum(pNew) );
    Vec_IntAppend( vMapping, vMapping2 );
    Vec_IntFree( vMapping2 );
    // attach mapping and packing
    assert( pNew->vMapping == NULL );
    pNew->vMapping = vMapping;
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p->pGia) );
    return pNew;
}